

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pragmaVtabOpen(sqlite3_vtab *pVtab,sqlite3_vtab_cursor **ppCursor)

{
  int iVar1;
  sqlite3_vtab_cursor *psVar2;
  int iVar3;
  
  iVar1 = sqlite3_initialize();
  iVar3 = 7;
  if (iVar1 == 0) {
    psVar2 = (sqlite3_vtab_cursor *)sqlite3Malloc(0x28);
    if (psVar2 != (sqlite3_vtab_cursor *)0x0) {
      psVar2[3].pVtab = (sqlite3_vtab *)0x0;
      psVar2[4].pVtab = (sqlite3_vtab *)0x0;
      psVar2[1].pVtab = (sqlite3_vtab *)0x0;
      psVar2[2].pVtab = (sqlite3_vtab *)0x0;
      psVar2->pVtab = pVtab;
      *ppCursor = psVar2;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int pragmaVtabOpen(sqlite3_vtab *pVtab, sqlite3_vtab_cursor **ppCursor){
  PragmaVtabCursor *pCsr;
  pCsr = (PragmaVtabCursor*)sqlite3_malloc(sizeof(*pCsr));
  if( pCsr==0 ) return SQLITE_NOMEM;
  memset(pCsr, 0, sizeof(PragmaVtabCursor));
  pCsr->base.pVtab = pVtab;
  *ppCursor = &pCsr->base;
  return SQLITE_OK;
}